

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengine.cpp
# Opt level: O2

void __thiscall QPaintEngine::drawLines(QPaintEngine *this,QLine *lines,int lineCount)

{
  undefined8 uVar1;
  long lVar2;
  ulong uVar3;
  long in_FS_OFFSET;
  LineF fl [256];
  double local_2038 [1024];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  memset(local_2038,0xff,0x2000);
  for (; lineCount != 0; lineCount = lineCount - (int)uVar3) {
    lVar2 = 0;
    for (uVar3 = 0; ((long)uVar3 < (long)lineCount && (uVar3 < 0x100)); uVar3 = uVar3 + 1) {
      uVar1 = *(undefined8 *)((long)&(lines->pt1).xp.m_i + lVar2);
      *(double *)((long)local_2038 + lVar2 * 2) = (double)(int)uVar1;
      *(double *)((long)local_2038 + lVar2 * 2 + 8) = (double)(int)((ulong)uVar1 >> 0x20);
      uVar1 = *(undefined8 *)((long)&(lines->pt2).xp.m_i + lVar2);
      *(double *)((long)local_2038 + lVar2 * 2 + 0x10) = (double)(int)uVar1;
      *(double *)((long)local_2038 + lVar2 * 2 + 0x18) = (double)(int)((ulong)uVar1 >> 0x20);
      lVar2 = lVar2 + 0x10;
    }
    (*this->_vptr_QPaintEngine[8])(this,local_2038,uVar3 & 0xffffffff);
    lines = (QLine *)((long)&(lines->pt1).xp.m_i + lVar2);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QPaintEngine::drawLines(const QLine *lines, int lineCount)
{
    struct PointF {
        qreal x;
        qreal y;
    };
    struct LineF {
        PointF p1;
        PointF p2;
    };
    Q_ASSERT(sizeof(PointF) == sizeof(QPointF));
    Q_ASSERT(sizeof(LineF) == sizeof(QLineF));
    LineF fl[256];
    while (lineCount) {
        int i = 0;
        while (i < lineCount && i < 256) {
            fl[i].p1.x = lines[i].x1();
            fl[i].p1.y = lines[i].y1();
            fl[i].p2.x = lines[i].x2();
            fl[i].p2.y = lines[i].y2();
            ++i;
        }
        drawLines((QLineF *)(void *)fl, i);
        lines += i;
        lineCount -= i;
    }
}